

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O1

int ovf::detail::parse::segment_data<float>
              (ovf_file *file,int index,ovf_segment *segment,float *data)

{
  parser_state *ppVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  exception ex;
  parse_error err;
  undefined1 *local_2e0 [2];
  undefined1 local_2d0 [16];
  float *local_2c0;
  memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b8;
  char *local_268 [2];
  ulong local_258;
  undefined **local_248;
  undefined1 *puStack_240;
  size_t local_238;
  size_t sStack_230;
  undefined1 local_228 [504];
  
  local_2c0 = data;
  tao::pegtl::
  memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>::
  memory_input<char_const(&)[1]>
            ((memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>
              *)&local_2b8,
             (file->_state->file_contents).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + index,(char (*) [1])0x155b1d);
  uVar3 = (ulong)(uint)file->version;
  if (uVar3 == 1) {
    local_268[0] = file->file_name;
    puStack_240 = local_228;
    local_238 = 0;
    local_248 = &PTR_grow_00178c20;
    sStack_230 = 500;
    format_str.size_ = 0x46;
    format_str.data_ = "libovf segment_data: OVF version \'{}\' in file \'{}\' is not supported...";
    args.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)local_268;
    args.types_ = fmt::v5::
                  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*,int>
                  ::TYPES;
    local_258 = uVar3;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_248,format_str,args);
    local_2e0[0] = local_2d0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2e0,puStack_240,puStack_240 + local_238);
  }
  else {
    if (file->version == 2) {
      file->_state->max_data_index = segment->valuedim * segment->N;
      local_238 = local_2b8.
                  super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .m_current.line;
      sStack_230 = local_2b8.
                   super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .m_current.byte_in_line;
      local_248 = (undefined **)
                  local_2b8.
                  super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .m_current.data;
      puStack_240 = (undefined1 *)
                    local_2b8.
                    super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_current.byte;
      bVar2 = tao::pegtl::internal::
              rule_conjunction<tao::pegtl::star<tao::pegtl::seq<ovf::detail::parse::v2::empty_line,_tao::pegtl::ascii::eol>_>,_ovf::detail::parse::v2::begin,_tao::pegtl::ascii::istring<'S',_'e',_'g',_'m',_'e',_'n',_'t'>,_tao::pegtl::ascii::eol,_tao::pegtl::star<tao::pegtl::seq<ovf::detail::parse::v2::empty_line,_tao::pegtl::ascii::eol>_>,_ovf::detail::parse::v2::header,_tao::pegtl::star<tao::pegtl::seq<ovf::detail::parse::v2::empty_line,_tao::pegtl::ascii::eol>_>,_tao::pegtl::sor<ovf::detail::parse::v2::data_text,_ovf::detail::parse::v2::data_csv,_ovf::detail::parse::v2::data_binary_4,_ovf::detail::parse::v2::data_binary_8>,_tao::pegtl::star<tao::pegtl::seq<ovf::detail::parse::v2::empty_line,_tao::pegtl::ascii::eol>_>,_tao::pegtl::until<tao::pegtl::seq<ovf::detail::parse::v2::end,_tao::pegtl::ascii::istring<'S',_'e',_'g',_'m',_'e',_'n',_'t'>_>_>,_tao::pegtl::ascii::eol>
              ::
              match<(tao::pegtl::apply_mode)1,_(tao::pegtl::rewind_mode)0,_ovf::detail::parse::v2::ovf_segment_data_action,_tao::pegtl::normal,_tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ovf_file_&,_const_ovf_segment_&,_float_*&>
                        (&local_2b8,file,segment,&local_2c0);
      if (!bVar2) {
        local_2b8.
        super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_current.line = local_238;
        local_2b8.
        super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_current.byte_in_line = sStack_230;
        local_2b8.
        super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_current.data = (char *)local_248;
        local_2b8.
        super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_current.byte = (size_t)puStack_240;
      }
      ppVar1 = file->_state;
      ppVar1->current_column = 0;
      ppVar1->current_line = 0;
      iVar4 = -1;
      if (!bVar2) {
        iVar4 = -3;
        std::__cxx11::string::_M_replace
                  ((ulong)&ppVar1->message_latest,0,
                   (char *)(ppVar1->message_latest)._M_string_length,0x158f00);
      }
      goto LAB_001371d8;
    }
    local_268[0] = file->file_name;
    puStack_240 = local_228;
    local_238 = 0;
    local_248 = &PTR_grow_00178c20;
    sStack_230 = 500;
    format_str_00.size_ = 0x46;
    format_str_00.data_ =
         "libovf segment_data: OVF version \'{}\' in file \'{}\' is not supported...";
    args_00.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)local_268;
    args_00.types_ =
         fmt::v5::
         format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*,int>
         ::TYPES;
    local_258 = uVar3;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_248,format_str_00,args_00);
    local_2e0[0] = local_2d0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2e0,puStack_240,puStack_240 + local_238);
  }
  local_248 = &PTR_grow_00178c20;
  if (puStack_240 != local_228) {
    operator_delete(puStack_240);
  }
  std::__cxx11::string::operator=((string *)&file->_state->message_latest,(string *)local_2e0);
  if (local_2e0[0] != local_2d0) {
    operator_delete(local_2e0[0]);
  }
  iVar4 = -3;
LAB_001371d8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8.
         super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .m_source._M_dataplus._M_p !=
      &local_2b8.
       super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .m_source.field_2) {
    operator_delete(local_2b8.
                    super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_source._M_dataplus._M_p);
  }
  return iVar4;
}

Assistant:

int segment_data(ovf_file & file, int index, const ovf_segment & segment, scalar * data)
    try
    {
        pegtl::memory_input<> in( file._state->file_contents[index], "" );
        int retcode = OVF_ERROR;
        bool success = false;

        if( file.version == 2 )
        {
            file._state->max_data_index = segment.N*segment.valuedim;
            success = pegtl::parse< v2::segment_data, v2::ovf_segment_data_action >( in, file, segment, data );
            file._state->current_line = 0;
            file._state->current_column = 0;
        }
        else if( file.version == 1 )
        {
            // TODO...
            file._state->message_latest = fmt::format(
                "libovf segment_data: OVF version \'{}\' in file \'{}\' is not supported...",
                file.file_name, file.version);
            return OVF_INVALID;
        }
        else
        {
            file._state->message_latest = fmt::format(
                "libovf segment_data: OVF version \'{}\' in file \'{}\' is not supported...",
                file.file_name, file.version);
            return OVF_INVALID;
        }

        if( success )
        {
            return OVF_OK;
        }
        else
        {
            file._state->message_latest = "libovf segment_data: no success in parsing";
            return OVF_INVALID;
        }
    }
    catch( pegtl::parse_error err )
    {
        file._state->message_latest = fmt::format(
            "libovf segment_data: pegtl parse error \'{}\'", + err.what());
        return OVF_ERROR;
    }
    catch( std::exception ex )
    {
        file._state->message_latest = fmt::format(
            "libovf segment_data: std::exception \'{}\'", + ex.what());
        return OVF_ERROR;
    }
    catch( ... )
    {
        // Make sure it really never crashes
        try
        {
            file._state->message_latest = "libovf segment_data: unknown exception";
            return OVF_ERROR;
        }
        catch( ... )
        {
            std::cerr << "libovf segment_data: unrecoverable error" << '\n';
            return OVF_ERROR;
        }
    }